

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O2

void __thiscall ValidateVulnerability::CheckIntensityBinID(ValidateVulnerability *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->v_).intensity_bin_id;
  if (uVar1 - 1 == this->prevIntBinID_) {
    return;
  }
  uVar2 = (this->super_Validate).lineno_;
  fprintf(_stderr,
          "ERROR: Non-contiguous intensity bin IDs %d on line %d and %d on line %d:\n%s\n%s\n",
          (ulong)(uint)this->prevIntBinID_,(ulong)(uVar2 - 1),(ulong)uVar1,(ulong)uVar2,
          this->prevLine_,&this->super_Validate);
  Validate::PrintErrorMessage(&this->super_Validate);
  return;
}

Assistant:

inline void ValidateVulnerability::CheckIntensityBinID() {

  if ((v_.intensity_bin_id - 1) != prevIntBinID_) {

    fprintf(stderr, "ERROR: Non-contiguous intensity bin IDs %d on line %d"
                    " and %d on line %d:\n%s\n%s\n",
            prevIntBinID_, lineno_ - 1, v_.intensity_bin_id, lineno_,
            prevLine_, line_);
    PrintErrorMessage();

  }

}